

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

bool togglePhasing(Server *server)

{
  bool bVar1;
  Config *this;
  basic_string_view<char,_std::char_traits<char>_> in_key;
  Server *server_local;
  
  this = (Config *)Jupiter::Config::operator[](server + 0x70,0xd,"RenX.Commands");
  in_key = sv("phasing",7);
  bVar1 = Jupiter::Config::get<bool>(this,in_key,false);
  bVar1 = togglePhasing(server,(bool)((bVar1 ^ 0xffU) & 1));
  return bVar1;
}

Assistant:

bool togglePhasing(RenX::Server *server) {
	return togglePhasing(server, !server->varData[RxCommandsSection].get<bool>("phasing"sv, false));
}